

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

glist_t fsg_model_trans(fsg_model_t *fsg,int32 i,int32 j)

{
  hash_table_t *h;
  int32 iVar1;
  int32 j_local;
  void *val;
  
  h = fsg->trans[i].trans;
  if ((h == (hash_table_t *)0x0) ||
     (j_local = j, iVar1 = hash_table_lookup_bkey(h,(char *)&j_local,4,&val), iVar1 < 0)) {
    val = (glist_t)0x0;
  }
  return (glist_t)val;
}

Assistant:

glist_t
fsg_model_trans(fsg_model_t * fsg, int32 i, int32 j)
{
    void *val;

    if (fsg->trans[i].trans == NULL)
        return NULL;
    if (hash_table_lookup_bkey(fsg->trans[i].trans, (char const *) &j,
                               sizeof(j), &val) < 0)
        return NULL;
    return (glist_t) val;
}